

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O1

void aom_v_predictor_64x64_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  uint8_t *puVar10;
  
  uVar1 = *(undefined8 *)above;
  uVar2 = *(undefined8 *)(above + 8);
  uVar3 = *(undefined8 *)(above + 0x10);
  uVar4 = *(undefined8 *)(above + 0x18);
  uVar5 = *(undefined8 *)(above + 0x20);
  uVar6 = *(undefined8 *)(above + 0x28);
  uVar7 = *(undefined8 *)(above + 0x30);
  uVar8 = *(undefined8 *)(above + 0x38);
  puVar10 = dst + 0x30;
  iVar9 = 0x40;
  do {
    *(undefined8 *)(puVar10 + -0x30) = uVar1;
    *(undefined8 *)(puVar10 + -0x28) = uVar2;
    *(undefined8 *)(puVar10 + -0x20) = uVar3;
    *(undefined8 *)(puVar10 + -0x18) = uVar4;
    *(undefined8 *)(puVar10 + -0x10) = uVar5;
    *(undefined8 *)(puVar10 + -8) = uVar6;
    *(undefined8 *)puVar10 = uVar7;
    *(undefined8 *)(puVar10 + 8) = uVar8;
    puVar10 = puVar10 + stride;
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  return;
}

Assistant:

static inline void v_predictor_64xh(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, int height) {
  const __m128i row0 = _mm_load_si128((__m128i const *)above);
  const __m128i row1 = _mm_load_si128((__m128i const *)(above + 16));
  const __m128i row2 = _mm_load_si128((__m128i const *)(above + 32));
  const __m128i row3 = _mm_load_si128((__m128i const *)(above + 48));
  for (int i = 0; i < height; ++i) {
    _mm_store_si128((__m128i *)dst, row0);
    _mm_store_si128((__m128i *)(dst + 16), row1);
    _mm_store_si128((__m128i *)(dst + 32), row2);
    _mm_store_si128((__m128i *)(dst + 48), row3);
    dst += stride;
  }
}